

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O1

int style_count(long *bits)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  iVar3 = 0;
  lVar4 = 0x10;
  do {
    uVar1 = *(ulong *)((long)&style_table[0].bit + lVar4);
    uVar2 = uVar1 + 0x1f;
    if (-1 < (long)uVar1) {
      uVar2 = uVar1;
    }
    uVar2 = bits[(int)(uVar2 >> 5)];
    dVar5 = exp2((double)((long)uVar1 % 0x20));
    iVar3 = (iVar3 + 1) - (uint)(((long)dVar5 & uVar2) == 0);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x70);
  return iVar3;
}

Assistant:

int style_count(long bits[])
{
	int count = 0;

	for (int i = 1; i < MAX_STYLE; i++)
	{
		if (IS_SET(bits, style_table[i].bit))
			count++;
	}

	return count;
}